

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O0

KeyIndexStorage * __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
::shrink(KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
         *this,unsigned_long shrinkBatchSize,string *newIndexFileName)

{
  unsigned_long uVar1;
  iterator iVar2;
  iterator iVar3;
  string *in_RCX;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  *in_RDX;
  KeyIndexStorage *in_RDI;
  KeyIndexStorage actualExportedKeys;
  KeyIndexStorage sortedBatch;
  vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
  notSortedKeys;
  string batchFileName;
  size_t batchI;
  unsigned_long sortedStorageSize;
  KeyIndexStorage exportedKeys;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  sortedBatches;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  tempFilesLock;
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_7UL,_void>
  notSortedKeysStream;
  size_t batchesCount;
  string tempSortedIndexFilename;
  string shrinkFilenamePrefix;
  KeyIndexStorage *updatedIndex;
  KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *in_stack_fffffffffffffba8;
  KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *in_stack_fffffffffffffbb0;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  *in_stack_fffffffffffffbb8;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  *in_stack_fffffffffffffbc0;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  *this_00;
  char *in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  allocator<char> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  KeyIndexStorage *this_01;
  string local_3e0 [88];
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *in_stack_fffffffffffffc78;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc98;
  unsigned_long in_stack_fffffffffffffca0;
  KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *in_stack_fffffffffffffca8;
  string local_270 [39];
  byte local_249;
  InnerRegisterSupplier *in_stack_fffffffffffffdb8;
  unsigned_long in_stack_fffffffffffffdc0;
  shared_ptr<supermap::io::FileManager> *in_stack_fffffffffffffdc8;
  Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
  in_stack_fffffffffffffdd0;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  *in_stack_fffffffffffffdd8;
  _Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_*,_false>
  in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
  in_stack_fffffffffffffdf0;
  KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *in_stack_fffffffffffffdf8;
  _Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_*,_false>
  in_stack_fffffffffffffe00;
  element_type *in_stack_fffffffffffffe08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe10;
  Findable<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_supermap::Key<3UL>_>
  in_stack_fffffffffffffe18;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  local_1d0;
  _Invoker_type local_198;
  undefined1 local_190 [56];
  string local_158 [32];
  string local_138 [32];
  ulong local_118;
  _Invoker_type local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [2];
  ulong local_80;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  string *local_20;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  *local_18;
  
  this_01 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  std::allocator<char>::~allocator(&local_41);
  std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  uVar1 = OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
          ::getItemsCount((OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
                           *)in_stack_fffffffffffffbb0);
  local_80 = ((uVar1 - 1) + (long)local_18) / (ulong)local_18;
  getNotSortedKeys(in_stack_fffffffffffffba8);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::vector((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
            *)0x2719a2);
  __lhs = local_c0;
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ::vector((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
            *)0x2719b4);
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ::reserve((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
             *)this_01,(size_type)__lhs);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::reserve((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
             *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
  exportKeys(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  __rhs = local_108;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ::shareStorageFile((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                      *)in_stack_fffffffffffffba8);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::push_back((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
               *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
  std::shared_ptr<supermap::io::TemporaryFile>::~shared_ptr
            ((shared_ptr<supermap::io::TemporaryFile> *)0x271a44);
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ::push_back((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
               *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
  local_110 = (_Invoker_type)
              OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              ::getItemsCount((OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
                               *)in_stack_fffffffffffffbb0);
  for (local_118 = 0; local_118 < local_80; local_118 = local_118 + 1) {
    std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    std::__cxx11::to_string((unsigned_long)__lhs);
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::~string((string *)(local_190 + 0x18));
    std::__cxx11::string::~string(local_158);
    local_198 = local_110;
    io::
    InputIterator<supermap::StorageValueIgnorer<supermap::Key<3ul>,supermap::ByteArray<4ul>>,unsigned_long,7ul,void>
    ::
    collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<3ul>,supermap::ByteArray<4ul>>&&,unsigned_long)_1_,supermap::KeyValue<supermap::Key<3ul>,unsigned_long>>
              ((InputIterator<supermap::StorageValueIgnorer<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_7UL,_void>
                *)in_stack_fffffffffffffe10._M_pi,
               (anon_class_8_1_4c1cc3bf)in_stack_fffffffffffffe18._vptr_Findable,
               (unsigned_long)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffbd8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
    iVar2 = std::
            vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
            ::begin((vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffba8);
    iVar3 = std::
            vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
            ::end((vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
                   *)in_stack_fffffffffffffba8);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe00,local_138);
    getFileManager(in_stack_fffffffffffffba8);
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
    ::function(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    in_stack_fffffffffffffba8 =
         (KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
          *)&stack0xfffffffffffffdc8;
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>
    ::
    SortedSingleFileIndexedStorage<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>>>>,supermap::KeyValueShrinkableStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&)_1_,supermap::KeyValueShrinkableStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&)_2_>
              (&local_1d0,iVar2._M_current,iVar3._M_current,0,&stack0xfffffffffffffe00,
               &stack0xfffffffffffffdf0);
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
    ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
                 *)0x271bf4);
    std::shared_ptr<supermap::io::FileManager>::~shared_ptr
              ((shared_ptr<supermap::io::FileManager> *)0x271c01);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    in_stack_fffffffffffffbd0 = &stack0xfffffffffffffdb8;
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
    ::shareStorageFile((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                        *)in_stack_fffffffffffffba8);
    std::
    vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
    ::push_back((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
                 *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
    std::shared_ptr<supermap::io::TemporaryFile>::~shared_ptr
              ((shared_ptr<supermap::io::TemporaryFile> *)0x271c49);
    std::
    vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
    ::push_back((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
                 *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::~SortedSingleFileIndexedStorage
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
                *)0x271c6d);
    std::
    vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
    ::~vector((vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
               *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string(local_138);
  }
  local_249 = 0;
  std::__cxx11::string::string(local_270,local_20);
  getFileManager(in_stack_fffffffffffffba8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  ::function(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  ::SortedSingleFileIndexedStorage
            ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
              *)in_stack_fffffffffffffde0._M_head_impl,in_stack_fffffffffffffdd8,
             (string *)in_stack_fffffffffffffdd0._vptr_Cloneable,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
               *)0x271f18);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x271f25);
  std::__cxx11::string::~string(local_270);
  std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  KeyValueShrinkableStorage
            ((KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
              *)in_stack_fffffffffffffe00._M_head_impl,in_stack_fffffffffffffdf8,
             (KeyIndexStorage *)in_stack_fffffffffffffdf0._vptr_Cloneable,in_stack_fffffffffffffde8,
             (string *)in_stack_fffffffffffffde0._M_head_impl,(size_t)in_stack_fffffffffffffdd8);
  resetWith(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  ~KeyValueShrinkableStorage(in_stack_fffffffffffffbb0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc78);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc98);
  std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  exportKeys(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::__cxx11::string::~string(local_3e0);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ::shareStorageFile((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                      *)in_stack_fffffffffffffba8);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::push_back((vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
               *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
  std::shared_ptr<supermap::io::TemporaryFile>::~shared_ptr
            ((shared_ptr<supermap::io::TemporaryFile> *)0x27205f);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ::resetWith(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  local_249 = 1;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  ::~SortedSingleFileIndexedStorage
            ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
              *)0x272086);
  this_00 = local_18;
  if ((local_249 & 1) == 0) {
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
    ::~SortedSingleFileIndexedStorage
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
                *)0x2721ce);
    this_00 = local_18;
  }
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  ::~SortedSingleFileIndexedStorage
            ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
              *)0x2721db);
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ::~vector((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
             *)this_00);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::~vector(this_00);
  io::
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_7UL,_void>
  ::~InputIterator((InputIterator<supermap::StorageValueIgnorer<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_7UL,_void>
                    *)0x272202);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

[[nodiscard]] KeyIndexStorage shrink(IndexT shrinkBatchSize, const std::string &newIndexFileName) {

        const std::string shrinkFilenamePrefix = "shrink";
        const std::string tempSortedIndexFilename = shrinkFilenamePrefix + "-sorted-keys";

        std::size_t batchesCount = (notSortedStorage_.getItemsCount() + shrinkBatchSize - 1) / shrinkBatchSize;
        auto notSortedKeysStream = getNotSortedKeys();
        std::vector<std::shared_ptr<io::TemporaryFile>> tempFilesLock;
        std::vector<KeyIndexStorage> sortedBatches;
        sortedBatches.reserve(batchesCount + 1);
        tempFilesLock.reserve(batchesCount + 1);

        KeyIndexStorage exportedKeys = exportKeys(shrinkBatchSize, tempSortedIndexFilename);
        tempFilesLock.push_back(exportedKeys.shareStorageFile());

        sortedBatches.push_back(std::move(exportedKeys));
        IndexT sortedStorageSize = sortedStorage_.getItemsCount();
        for (std::size_t batchI = 0; batchI < batchesCount; ++batchI) {
            const std::string batchFileName = shrinkFilenamePrefix + "-batch-" + std::to_string(batchI);
            std::vector<KeyIndex> notSortedKeys = notSortedKeysStream.collectWith(
                [sortedStorageSize](ValueIgnorer &&svi, IndexT index) {
                    return KeyIndex{std::move(svi.key), index + sortedStorageSize};
                },
                shrinkBatchSize
            );
            KeyIndexStorage sortedBatch(
                notSortedKeys.begin(),
                notSortedKeys.end(),
                false,
                batchFileName,
                getFileManager(),
                [](const KeyIndex &a, const KeyIndex &b) { return a.key < b.key; },
                [](const KeyIndex &a, const KeyIndex &b) { return a.key == b.key; },
                innerRegisterSupplier_
            );
            tempFilesLock.push_back(sortedBatch.shareStorageFile());
            assert(sortedBatch.getItemsCount() > 0 && "Batch file can not be empty");
            sortedBatches.push_back(std::move(sortedBatch));
        }

        KeyIndexStorage updatedIndex(
            sortedBatches,
            newIndexFileName,
            getFileManager(),
            shrinkBatchSize,
            innerRegisterSupplier_
        );

        resetWith(KeyValueShrinkableStorage(
            *this,
            updatedIndex,
            shrinkFilenamePrefix + "-new-not-sorted",
            shrinkFilenamePrefix + "-new-sorted",
            shrinkBatchSize
        ));

        KeyIndexStorage actualExportedKeys
            = exportKeys(shrinkBatchSize, shrinkFilenamePrefix + "-actual-index");
        tempFilesLock.push_back(actualExportedKeys.shareStorageFile());
        updatedIndex.resetWith(std::move(actualExportedKeys));
        return updatedIndex;
    }